

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityCapabilities.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EntityCapabilities::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityCapabilities *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  EntityCapabilities *local_18;
  EntityCapabilities *this_local;
  
  local_18 = this;
  this_local = (EntityCapabilities *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Entity Capabilities");
  poVar1 = std::operator<<(poVar1,"\n\tAmmunition Supply:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->field_0).m_ui16Data & 1);
  poVar1 = std::operator<<(poVar1,"\n\tFuel Supply:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->field_0).m_ui16Data >> 1 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tRecovery Service:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->field_0).m_ui16Data >> 2 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tRepair Service:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->field_0).m_ui16Data >> 3 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tADS-B Service:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->field_0).m_ui16Data >> 4 & 1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EntityCapabilities::GetAsString() const
{
    KStringStream ss;

    ss << "Entity Capabilities"
       << "\n\tAmmunition Supply:    " << m_AmmunitionSupply
       << "\n\tFuel Supply:          " << m_FuelSupply
       << "\n\tRecovery Service:     " << m_RecoveryService
       << "\n\tRepair Service:       " << m_RepairService
	   << "\n\tADS-B Service:        " << m_ADSB
       << "\n";

    return ss.str();
}